

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

Result_t * __thiscall
Kumu::DirScannerEx::GetNext
          (Result_t *__return_storage_ptr__,DirScannerEx *this,string *next_item_name,
          DirectoryEntryType_t *next_item_type)

{
  uchar uVar1;
  dirent *pdVar2;
  dirent *entry;
  DirectoryEntryType_t *next_item_type_local;
  string *next_item_name_local;
  DirScannerEx *this_local;
  
  if (this->m_Handle == (DIR *)0x0) {
    Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_FILEOPEN);
  }
  else {
    pdVar2 = readdir((DIR *)this->m_Handle);
    if (pdVar2 == (dirent *)0x0) {
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_ENDOFFILE);
    }
    else {
      strlen(pdVar2->d_name);
      std::__cxx11::string::assign((char *)next_item_name,(ulong)pdVar2->d_name);
      uVar1 = pdVar2->d_type;
      if (uVar1 == '\x04') {
        *next_item_type = DET_DIR;
      }
      else if (uVar1 == '\b') {
        *next_item_type = DET_FILE;
      }
      else if (uVar1 == '\n') {
        *next_item_type = DET_LINK;
      }
      else {
        *next_item_type = DET_DEV;
      }
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::DirScannerEx::GetNext(std::string& next_item_name, DirectoryEntryType_t& next_item_type)
{
  if ( m_Handle == 0 )
    return RESULT_FILEOPEN;

#if defined(__sun) && defined(__SVR4)
  struct stat s;
#endif
  struct dirent* entry;

  for (;;)
    {
      if ( ( entry = readdir(m_Handle) ) == 0 )
	return RESULT_ENDOFFILE;

      break;
    }

  next_item_name.assign(entry->d_name, strlen(entry->d_name));

#if defined(__sun) && defined(__SVR4)

  stat(entry->d_name, &s);

  switch ( s.st_mode )
    {
    case S_IFDIR:
      next_item_type = DET_DIR;
      break;

    case S_IFREG:
      next_item_type = DET_FILE;
      break;

    case S_IFLNK:
      next_item_type = DET_LINK;
      break;

    default:
      next_item_type = DET_DEV;
    }
#else // __sun 
  switch ( entry->d_type )
    {
    case DT_DIR:
      next_item_type = DET_DIR;
      break;

    case DT_REG:
      next_item_type = DET_FILE;
      break;

    case DT_LNK:
      next_item_type = DET_LINK;
      break;

    default:
      next_item_type = DET_DEV;
    }
#endif // __sun
  return RESULT_OK;
}